

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O3

Gia_Man_t * Abc_NtkTestTimPerformSynthesis(Gia_Man_t *p,int fChoices)

{
  Aig_Man_t *pAig;
  Aig_Man_t *p_00;
  Gia_Man_t *pGVar1;
  Dch_Pars_t *pPars;
  Dch_Pars_t Pars;
  Dch_Pars_t DStack_58;
  
  Dch_ManSetDefaultParams(&DStack_58);
  pAig = Gia_ManToAig(p,0);
  if (fChoices == 0) {
    p_00 = Dar_ManCompress2(pAig,1,1,1,0,0);
    Aig_ManStop(pAig);
  }
  else {
    p_00 = Dar_ManChoiceNew(pAig,&DStack_58);
  }
  pGVar1 = Gia_ManFromAig(p_00);
  Aig_ManStop(p_00);
  return pGVar1;
}

Assistant:

Gia_Man_t * Abc_NtkTestTimPerformSynthesis( Gia_Man_t * p, int fChoices )
{
    Gia_Man_t * pGia;
    Aig_Man_t * pNew, * pTemp;
    Dch_Pars_t Pars, * pPars = &Pars;
    Dch_ManSetDefaultParams( pPars );
    pNew = Gia_ManToAig( p, 0 );
    if ( fChoices )
        pNew = Dar_ManChoiceNew( pNew, pPars );
    else
    {
        pNew = Dar_ManCompress2( pTemp = pNew, 1, 1, 1, 0, 0 );
        Aig_ManStop( pTemp );
    }
    pGia = Gia_ManFromAig( pNew );
    Aig_ManStop( pNew );
    return pGia;
}